

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O1

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Array<flatbuffers::Offset<void>,(unsigned_short)65535>,unsigned_short>
          (JsonPrinter *this,long param_2,uint param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  pcVar4 = (char *)(ulong)param_3;
  cVar1 = '\0';
  if (param_4->base_type == BASE_TYPE_STRUCT) {
    cVar1 = param_4->struct_def->fixed;
  }
  iVar2 = this->opts->indent_step;
  iVar6 = 0;
  if (0 < iVar2) {
    iVar6 = iVar2;
  }
  std::__cxx11::string::push_back((char)this->text);
  if (-1 < this->opts->indent_step) {
    std::__cxx11::string::push_back((char)this->text);
  }
  bVar7 = (short)param_3 != 0;
  pcVar3 = pcVar4;
  if (bVar7) {
    uVar5 = 0;
    do {
      if (uVar5 != 0) {
        if (this->opts->protobuf_ascii_alike == false) {
          std::__cxx11::string::push_back((char)this->text);
        }
        if (-1 < this->opts->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
      }
      std::__cxx11::string::_M_replace_aux
                ((ulong)this->text,this->text->_M_string_length,0,(char)(iVar6 + param_5));
      if (cVar1 == '\0') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/array.h"
                      ,0xae,
                      "return_type flatbuffers::Array<flatbuffers::Offset<>, 65535>::operator[](uoffset_t) const [T = flatbuffers::Offset<>, length = 65535]"
                     );
      }
      pcVar3 = PrintOffset(this,(void *)(param_4->struct_def->bytesize * uVar5 + param_2),param_4,
                           iVar6 + param_5,param_6,(soffset_t)uVar5);
      if (pcVar3 != (char *)0x0) break;
      uVar5 = uVar5 + 1;
      bVar7 = uVar5 < ((ulong)pcVar4 & 0xffff);
      pcVar3 = pcVar4;
    } while (uVar5 != ((ulong)pcVar4 & 0xffff));
  }
  if (!bVar7) {
    if (-1 < this->opts->indent_step) {
      std::__cxx11::string::push_back((char)this->text);
    }
    pcVar3 = (char *)0x0;
    std::__cxx11::string::_M_replace_aux
              ((ulong)this->text,this->text->_M_string_length,0,(char)param_5);
    std::__cxx11::string::push_back((char)this->text);
  }
  return pcVar3;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }